

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.h
# Opt level: O2

void __thiscall LidarMeasurement::~LidarMeasurement(LidarMeasurement *this)

{
  Measurement::~Measurement(&this->super_Measurement);
  operator_delete(this);
  return;
}

Assistant:

virtual ~LidarMeasurement() {}